

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O0

void __thiscall PSBTOutput::FromSignatureData(PSBTOutput *this,SignatureData *sigdata)

{
  long lVar1;
  bool bVar2;
  map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
  *this_00;
  reference __args;
  long in_RSI;
  pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>
  *in_RDI;
  long in_FS_OFFSET;
  type *leaf_origin;
  type *pubkey;
  map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
  *__range1_1;
  pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_> *entry;
  map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  *__range1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  pair<CPubKey,_KeyOriginInfo> *in_stack_ffffffffffffff60;
  pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
  *in_stack_ffffffffffffff68;
  TaprootBuilder *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_RDI);
  if ((bVar2) &&
     (bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_RDI), !bVar2)) {
    CScript::operator=((CScript *)in_stack_ffffffffffffff68,(CScript *)in_stack_ffffffffffffff60);
  }
  bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_RDI);
  if ((bVar2) &&
     (bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_RDI), !bVar2)) {
    CScript::operator=((CScript *)in_stack_ffffffffffffff68,(CScript *)in_stack_ffffffffffffff60);
  }
  std::
  map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  ::begin((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
           *)in_stack_ffffffffffffff60);
  std::
  map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  ::end((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
         *)in_stack_ffffffffffffff60);
  while (bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff68,
                                 (_Self *)in_stack_ffffffffffffff60), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>::
    operator*((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
               *)in_RDI);
    std::
    map<CPubKey,KeyOriginInfo,std::less<CPubKey>,std::allocator<std::pair<CPubKey_const,KeyOriginInfo>>>
    ::emplace<std::pair<CPubKey,KeyOriginInfo>const&>
              ((map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
                *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>::
    operator++((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
                *)in_RDI);
  }
  bVar2 = XOnlyPubKey::IsNull(&in_RDI->first);
  if (!bVar2) {
    *(pointer *)in_RDI[1].first.m_keydata.super_base_blob<256U>.m_data._M_elems =
         *(pointer *)(in_RSI + 0x80);
    *(pointer *)((long)in_RDI[1].first.m_keydata.super_base_blob<256U>.m_data._M_elems + 8) =
         *(pointer *)(in_RSI + 0x88);
    *(pointer *)((long)in_RDI[1].first.m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10) =
         *(pointer *)(in_RSI + 0x90);
    *(undefined8 *)((long)in_RDI[1].first.m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18) =
         *(undefined8 *)(in_RSI + 0x98);
  }
  bVar2 = std::optional<TaprootBuilder>::has_value((optional<TaprootBuilder> *)in_RDI);
  if (bVar2) {
    std::optional<TaprootBuilder>::operator->((optional<TaprootBuilder> *)in_RDI);
    bVar2 = TaprootBuilder::HasScripts((TaprootBuilder *)in_RDI);
    if (bVar2) {
      std::optional<TaprootBuilder>::operator->((optional<TaprootBuilder> *)in_RDI);
      TaprootBuilder::GetTreeTuples(in_stack_ffffffffffffffa8);
      std::
      vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::operator=((vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)in_stack_ffffffffffffff68,
                  (vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)in_stack_ffffffffffffff60);
      std::
      vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~vector((vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)in_stack_ffffffffffffff68);
    }
  }
  this_00 = (map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
             *)(in_RSI + 0x208);
  std::
  map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
  ::begin((map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
           *)in_stack_ffffffffffffff60);
  std::
  map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
  ::end((map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
         *)in_stack_ffffffffffffff60);
  while (bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff68,
                                 (_Self *)in_stack_ffffffffffffff60), ((bVar2 ^ 0xffU) & 1) != 0) {
    __args = std::
             _Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
                          *)in_RDI);
    in_stack_ffffffffffffff68 =
         (pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo> *)
         std::
         get<0ul,XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>
                   (in_RDI);
    in_stack_ffffffffffffff60 =
         (pair<CPubKey,_KeyOriginInfo> *)
         std::
         get<1ul,XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>
                   (in_RDI);
    std::
    map<XOnlyPubKey,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
    ::
    emplace<XOnlyPubKey_const&,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>const&>
              (this_00,&__args->first,in_stack_ffffffffffffff68);
    std::
    _Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
                  *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PSBTOutput::FromSignatureData(const SignatureData& sigdata)
{
    if (redeem_script.empty() && !sigdata.redeem_script.empty()) {
        redeem_script = sigdata.redeem_script;
    }
    if (witness_script.empty() && !sigdata.witness_script.empty()) {
        witness_script = sigdata.witness_script;
    }
    for (const auto& entry : sigdata.misc_pubkeys) {
        hd_keypaths.emplace(entry.second);
    }
    if (!sigdata.tr_spenddata.internal_key.IsNull()) {
        m_tap_internal_key = sigdata.tr_spenddata.internal_key;
    }
    if (sigdata.tr_builder.has_value() && sigdata.tr_builder->HasScripts()) {
        m_tap_tree = sigdata.tr_builder->GetTreeTuples();
    }
    for (const auto& [pubkey, leaf_origin] : sigdata.taproot_misc_pubkeys) {
        m_tap_bip32_paths.emplace(pubkey, leaf_origin);
    }
}